

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linetype.cpp
# Opt level: O0

bool __thiscall ON_Linetype::ClearPattern(ON_Linetype *this)

{
  bool bVar1;
  ON_Linetype *this_local;
  
  bVar1 = PatternIsLocked(this);
  if (!bVar1) {
    this->m_is_set_bits = this->m_is_set_bits & 0xfe;
    ON_SimpleArray<ON_LinetypeSegment>::Destroy(&this->m_private->m_segments);
  }
  bVar1 = PatternIsSet(this);
  return !bVar1;
}

Assistant:

bool ON_Linetype::ClearPattern()
{
  if (false == PatternIsLocked())
  {
    m_is_set_bits &= ~ON_Linetype::pattern_bit;
    m_private->m_segments.Destroy();
  }
  return (false == PatternIsSet());
}